

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

size_t __thiscall lan::db::str_get_str_end(db *this,string *content,size_t spoint)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  bool jmp;
  size_t index;
  size_t spoint_local;
  string *content_local;
  db *this_local;
  
  do {
    bVar1 = false;
    uVar2 = std::__cxx11::string::find((char)content,0x22);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content);
    if ((((*pcVar3 == '\"') &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content), *pcVar3 == '\\')) &&
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content), *pcVar3 == '\\')) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content), *pcVar3 == '\\')) {
      bVar1 = true;
    }
    bVar5 = true;
    if ((!bVar1) && (bVar5 = false, uVar2 != 0)) {
      uVar4 = std::__cxx11::string::length();
      bVar5 = false;
      if (uVar2 < uVar4) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content);
        bVar5 = false;
        if (*pcVar3 == '\"') {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content);
          bVar5 = false;
          if (*pcVar3 == '\\') {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content);
            bVar5 = *pcVar3 != '\\';
          }
        }
      }
    }
  } while (bVar5);
  return uVar2;
}

Assistant:

size_t db::str_get_str_end(std::string content, size_t spoint){
            size_t index;
            bool jmp (false);
            do {
                jmp = false;
                index = content.find('\"', spoint);
                if(content[index] == '"' and content[index-1] == '\\' and content[index-2] == '\\' and content[index-3] == '\\') jmp = true;
                spoint = index+1;
            } while(jmp or (index > 0 and index < content.length() and (content[index] == '"' and content[index-1] == '\\' and content[index-2] != '\\')));
            return index;
        }